

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

BufferResult __thiscall
tonk::UDPSocket::onUnrecognizedSource
          (UDPSocket *this,UDPAddress *addr,uint64_t receiveUsec,DatagramBuffer datagram)

{
  DatagramBuffer datagram_00;
  DatagramBuffer datagram_01;
  __pthread_internal_list *p_Var1;
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *this_00;
  node *pnVar2;
  undefined8 in_RDX;
  long in_RDI;
  long in_stack_00000008;
  uint in_stack_00000010;
  Connection *connection_3;
  IConnection *icon_2;
  uint64_t key_3;
  uint32_t id;
  Connection *connection_1;
  IConnection *icon_1;
  uint32_t connKey;
  uint64_t key_2;
  uint64_t key_1;
  HandshakeType handshakeType;
  uint8_t *handshakeData;
  uint handshakeBytes;
  Connection *connection;
  IConnection *icon;
  uint32_t key;
  uint unconnectedType;
  FlagsReader flags;
  uint8_t *footer;
  Locker locker_3;
  Locker locker_1;
  Locker locker;
  IConnection *connection_2;
  Locker locker_2;
  int index;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_6;
  Lock *in_stack_ffffffffffffe578;
  LogStringBuffer *in_stack_ffffffffffffe580;
  uint *in_stack_ffffffffffffe590;
  uint uVar3;
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *in_stack_ffffffffffffe598;
  Allocator *in_stack_ffffffffffffe5a0;
  type *in_stack_ffffffffffffe5a8;
  LogStringBuffer *buffer_00;
  strand *in_stack_ffffffffffffe5b0;
  key_t key_00;
  undefined1 *puVar4;
  LogStringBuffer *in_stack_ffffffffffffe5b8;
  OutputWorker *in_stack_ffffffffffffe5c0;
  LogStringBuffer *this_01;
  ConnectionAddrMap *in_stack_ffffffffffffe5c8;
  strand *in_stack_ffffffffffffe5d0;
  long lVar5;
  type *in_stack_ffffffffffffe5d8;
  Connection *in_stack_ffffffffffffe5e0;
  uint64_t in_stack_ffffffffffffe5e8;
  Connection *in_stack_ffffffffffffe5f0;
  IUDPSender *in_stack_ffffffffffffe5f8;
  BufferAllocator *in_stack_ffffffffffffe600;
  BufferAllocator *in_stack_ffffffffffffe608;
  BufferAllocator *pBVar6;
  UDPAddress *in_stack_ffffffffffffe610;
  BufferAllocator *in_stack_ffffffffffffe618;
  Connection *in_stack_ffffffffffffe620;
  undefined8 in_stack_ffffffffffffe630;
  IConnection *pIVar7;
  undefined8 in_stack_ffffffffffffe638;
  undefined8 in_stack_ffffffffffffe640;
  BufferAllocator *in_stack_ffffffffffffe648;
  uint32_t local_1824;
  string local_1820 [64];
  IConnection *local_17e0;
  IConnection *local_17d8;
  undefined4 local_17cc;
  uint64_t local_17c8;
  uint64_t local_17b8;
  undefined8 local_1790;
  uint64_t local_1768;
  HandshakeType local_175c;
  uint8_t *local_1758;
  uint local_1724;
  string local_16c8 [32];
  IConnection *local_16a8;
  IConnection *local_16a0;
  undefined4 local_1694;
  uint local_1690;
  FlagsReader local_1689;
  uint8_t *local_1688;
  undefined8 local_1680;
  BufferResult local_1664;
  long local_1660;
  long local_1658;
  long local_1650;
  undefined8 local_1620;
  undefined8 local_15f0;
  undefined8 local_15c0;
  FlagsReader *local_15b8;
  FlagsReader *local_15b0;
  uint8_t *local_15a8;
  uint8_t *local_15a0;
  char *local_1598;
  string *local_1590;
  char *local_1588;
  long local_1580;
  int *local_1578;
  char *local_1570;
  uint *local_1568;
  char *local_1560;
  uint *local_1558;
  char *local_1550;
  long local_1548;
  FlagsReader *local_1540;
  char *local_1538;
  uint *local_1530;
  char *local_1528;
  long local_1520;
  string *local_1518;
  char *local_1510;
  long local_1508;
  IConnection *local_14f0;
  uint32_t local_14dc;
  long local_14d8;
  RefCounter *local_14d0;
  IConnection *local_14c8;
  uint *local_14c0;
  char *local_14b8;
  BufferAllocator *local_14b0;
  RefCounter *local_14a8;
  uint *local_14a0;
  char *local_1498;
  long local_1490;
  char *local_1488;
  LogStringBuffer *local_1480;
  uint local_1474;
  uint32_t *local_1470;
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *local_1468;
  IConnection *local_1460;
  char *local_1458;
  string *local_1450;
  char *local_1448;
  undefined4 local_143c;
  long local_1438;
  undefined4 local_142c;
  long local_1428;
  undefined1 local_1410 [16];
  ostream aoStack_1400 [376];
  char *local_1288;
  string *local_1280;
  char *local_1278;
  undefined4 local_126c;
  long local_1268;
  char *local_1260;
  string *local_1258;
  char *local_1250;
  string *local_1248;
  undefined1 *local_1240;
  long local_1238;
  string *local_1230;
  undefined1 *local_1228;
  long local_1220;
  string *local_1218;
  undefined1 *local_1210;
  char *local_1208;
  string *local_1200;
  char *local_11f8;
  undefined1 *local_11f0;
  long local_11e8;
  char *local_11e0;
  undefined1 *local_11d8;
  long local_11d0;
  char *local_11c8;
  undefined1 *local_11c0;
  char *local_11b8;
  string *local_11b0;
  undefined1 *local_11a8;
  long local_11a0;
  string *local_1198;
  undefined1 *local_1190;
  long local_1188;
  string *local_1180;
  undefined1 *local_1178;
  char *local_1170;
  undefined1 *local_1168;
  long local_1160;
  char *local_1158;
  undefined1 *local_1150;
  char *local_1148;
  uint *local_1140;
  char *local_1138;
  uint *local_1130;
  char *local_1128;
  undefined4 local_111c;
  long local_1118;
  undefined4 local_110c;
  long local_1108;
  undefined1 local_10f0 [16];
  ostream aoStack_10e0 [376];
  char *local_f68;
  uint *local_f60;
  char *local_f58;
  uint *local_f50;
  char *local_f48;
  undefined4 local_f3c;
  long local_f38;
  char *local_f30;
  uint *local_f28;
  char *local_f20;
  uint *local_f18;
  char *local_f10;
  string *local_f08;
  undefined1 *local_f00;
  long local_ef8;
  string *local_ef0;
  undefined1 *local_ee8;
  long local_ee0;
  string *local_ed8;
  undefined1 *local_ed0;
  char *local_ec8;
  uint *local_ec0;
  char *local_eb8;
  uint *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  long local_e98;
  char *local_e90;
  undefined1 *local_e88;
  long local_e80;
  char *local_e78;
  undefined1 *local_e70;
  char *local_e68;
  uint *local_e60;
  char *local_e58;
  uint *local_e50;
  undefined1 *local_e48;
  long local_e40;
  uint *local_e38;
  undefined1 *local_e30;
  long local_e28;
  uint *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  uint *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  long local_df0;
  char *local_de8;
  undefined1 *local_de0;
  long local_dd8;
  char *local_dd0;
  uint *local_dc8;
  undefined1 *local_dc0;
  long local_db8;
  char *local_db0;
  undefined1 *local_da8;
  uint *local_da0;
  undefined1 *local_d98;
  long local_d90;
  uint *local_d88;
  undefined1 *local_d80;
  char *local_d78;
  undefined1 *local_d70;
  long local_d68;
  char *local_d60;
  undefined1 *local_d58;
  char *local_d50;
  uint *local_d48;
  char *local_d40;
  undefined4 local_d34;
  long local_d30;
  undefined4 local_d24;
  long local_d20;
  undefined1 local_d08 [16];
  ostream aoStack_cf8 [376];
  char *local_b80;
  uint *local_b78;
  char *local_b70;
  undefined4 local_b64;
  long local_b60;
  char *local_b58;
  uint *local_b50;
  char *local_b48;
  string *local_b40;
  undefined1 *local_b38;
  long local_b30;
  string *local_b28;
  undefined1 *local_b20;
  long local_b18;
  string *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  uint *local_af8;
  char *local_af0;
  undefined1 *local_ae8;
  long local_ae0;
  char *local_ad8;
  uint *local_ad0;
  undefined1 *local_ac8;
  long local_ac0;
  uint *local_ab8;
  undefined1 *local_ab0;
  long local_aa8;
  uint *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  undefined1 *local_a88;
  long local_a80;
  char *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  long local_a58;
  char *local_a50;
  undefined1 *local_a48;
  string *local_a40;
  char *local_a38;
  undefined4 local_a2c;
  long local_a28;
  undefined4 local_a1c;
  long local_a18;
  undefined1 local_a00 [16];
  ostream aoStack_9f0 [376];
  string *local_878;
  char *local_870;
  undefined4 local_864;
  long local_860;
  string *local_858;
  char *local_850;
  string *local_848;
  undefined1 *local_840;
  long local_838;
  string *local_830;
  undefined1 *local_828;
  long local_820;
  string *local_818;
  undefined1 *local_810;
  string *local_808;
  char *local_800;
  undefined1 *local_7f8;
  long local_7f0;
  string *local_7e8;
  undefined1 *local_7e0;
  long local_7d8;
  string *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  long local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  uint *local_798;
  char *local_790;
  undefined4 local_784;
  BufferAllocator *local_780;
  undefined4 local_774;
  BufferAllocator *local_770;
  UDPAddress local_758 [14];
  uint *local_5d0;
  char *local_5c8;
  undefined4 local_5bc;
  BufferAllocator *local_5b8;
  uint *local_5b0;
  char *local_5a8;
  string *local_5a0;
  UDPAddress *local_598;
  BufferAllocator *local_590;
  string *local_588;
  UDPAddress *local_580;
  BufferAllocator *local_578;
  string *local_570;
  UDPAddress *local_568;
  uint *local_560;
  char *local_558;
  UDPAddress *local_550;
  BufferAllocator *local_548;
  uint *local_540;
  UDPAddress *local_538;
  BufferAllocator *local_530;
  uint *local_528;
  UDPAddress *local_520;
  char *local_518;
  UDPAddress *local_510;
  BufferAllocator *local_508;
  char *local_500;
  UDPAddress *local_4f8;
  uint *local_4f0;
  char *local_4e8;
  undefined4 local_4dc;
  long local_4d8;
  undefined4 local_4cc;
  long local_4c8;
  undefined1 local_4b0 [392];
  uint *local_328;
  char *local_320;
  undefined4 local_314;
  long local_310;
  uint *local_308;
  char *local_300;
  string *local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  string *local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  string *local_2c8;
  undefined1 *local_2c0;
  uint *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  long local_2a0;
  char *local_298;
  undefined1 *local_290;
  long local_288;
  char *local_280;
  undefined1 *local_278;
  uint *local_270;
  undefined1 *local_268;
  long local_260;
  uint *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  LogStringBuffer *local_238;
  undefined4 local_22c;
  LogStringBuffer *local_228;
  undefined1 local_210 [392];
  char *local_88;
  undefined4 local_7c;
  LogStringBuffer *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_1688 = (uint8_t *)(in_stack_00000008 + (ulong)in_stack_00000010 + -3);
  local_1680 = in_RDX;
  protocol::FlagsReader::FlagsReader(&local_1689,*local_1688);
  local_15b8 = &local_1689;
  if ((local_1689.FlagsByte & 0x80) == 0) {
    local_15b0 = &local_1689;
    local_1690 = local_1689.FlagsByte & 0x7f;
    if ((local_1690 == 1) && (in_stack_00000010 == 5)) {
      local_15a0 = local_1688 + -2;
      local_15a8 = local_1688 + 1;
      local_1694 = CONCAT22(*(undefined2 *)local_15a0,*(undefined2 *)local_15a8);
      local_16a8 = P2PConnectionKeyMap::FindByKey
                             ((P2PConnectionKeyMap *)in_stack_ffffffffffffe5b8,
                              (key_t)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
      local_16a0 = local_16a8;
      if (local_16a8 == (IConnection *)0x0) {
        lVar5 = *(long *)(in_RDI + 0x90);
        HexString_abi_cxx11_((uint64_t)in_stack_ffffffffffffe5d8);
        local_1588 = "NAT probe received with key = ";
        local_1590 = local_16c8;
        local_1598 = " not found in map";
        local_143c = 3;
        local_1448 = "NAT probe received with key = ";
        local_1458 = " not found in map";
        local_142c = 3;
        local_1580 = lVar5;
        local_1450 = local_1590;
        local_1438 = lVar5;
        local_1428 = lVar5;
        if (*(int *)(lVar5 + 8) < 4) {
          local_126c = 3;
          local_1278 = "NAT probe received with key = ";
          local_1288 = " not found in map";
          local_1280 = local_1590;
          local_1268 = lVar5;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
          local_1248 = (string *)(lVar5 + 0x38);
          local_1240 = local_1410;
          local_1250 = local_1278;
          local_1258 = local_1280;
          local_1260 = local_1288;
          local_1238 = lVar5;
          local_1230 = local_1248;
          local_1228 = local_1240;
          local_1220 = lVar5;
          local_1218 = local_1248;
          local_1210 = local_1240;
          std::operator<<(aoStack_1400,local_1248);
          local_11f0 = local_1240;
          local_11f8 = local_1250;
          local_1200 = local_1258;
          local_1208 = local_1260;
          local_11d8 = local_1240;
          local_11e0 = local_1250;
          local_11c0 = local_1240;
          local_11c8 = local_1250;
          local_11e8 = lVar5;
          local_11d0 = lVar5;
          std::operator<<((ostream *)(local_1240 + 0x10),local_1250);
          local_11a8 = local_11f0;
          local_11b0 = local_1200;
          local_11b8 = local_1208;
          local_1190 = local_11f0;
          local_1198 = local_1200;
          local_1178 = local_11f0;
          local_1180 = local_1200;
          local_11a0 = lVar5;
          local_1188 = lVar5;
          std::operator<<((ostream *)(local_11f0 + 0x10),local_1200);
          local_1168 = local_11a8;
          local_1170 = local_11b8;
          local_1150 = local_11a8;
          local_1158 = local_11b8;
          local_1160 = lVar5;
          std::operator<<((ostream *)(local_11a8 + 0x10),local_11b8);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18cc78);
        }
        std::__cxx11::string::~string(local_16c8);
      }
      else {
        Connection::OnNATProbe
                  (in_stack_ffffffffffffe5e0,(UDPAddress *)in_stack_ffffffffffffe5d8,
                   (uint32_t)((ulong)in_stack_ffffffffffffe5d0 >> 0x20),in_stack_ffffffffffffe5c8,
                   (IUDPSender *)in_stack_ffffffffffffe5c0);
      }
      local_1664 = Free;
    }
    else if (((local_1689.FlagsByte & 0x7f) == 0) &&
            ((6 < in_stack_00000010 &&
             (local_1578 = (int *)(local_1688 + -4), *local_1578 == 0x4b6e6f54)))) {
      if (*(long *)(*(long *)(in_RDI + 200) + 0x60) == 0) {
        local_1664 = Free;
      }
      else {
        local_1650 = *(long *)(in_RDI + 0x88);
        std::__atomic_base<int>::operator++((__atomic_base<int> *)(local_1650 + 0x28));
        std::__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x18cd93);
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe580,
                   (basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe578);
        asio::io_context::strand::
        post<tonk::UDPSocket::onUnrecognizedSource(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_long,tonk::DatagramBuffer)::__0>
                  (in_stack_ffffffffffffe5d0,(type *)in_stack_ffffffffffffe5c8);
        local_1664 = InUse;
      }
    }
    else {
      lVar5 = *(long *)(in_RDI + 0x90);
      local_1568 = &stack0x00000010;
      local_1550 = "Ignoring unexpected unconnected type ";
      local_1558 = &local_1690;
      local_1560 = " from unrecognized source (bytes = ";
      local_1570 = ")";
      local_111c = 3;
      local_1128 = "Ignoring unexpected unconnected type ";
      local_1138 = " from unrecognized source (bytes = ";
      local_1148 = ")";
      local_110c = 3;
      if (*(int *)(lVar5 + 8) < 4) {
        local_f3c = 3;
        local_f48 = "Ignoring unexpected unconnected type ";
        local_f58 = " from unrecognized source (bytes = ";
        local_f68 = ")";
        local_1548 = lVar5;
        local_1140 = local_1568;
        local_1130 = local_1558;
        local_1118 = lVar5;
        local_1108 = lVar5;
        local_f60 = local_1568;
        local_f50 = local_1558;
        local_f38 = lVar5;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
        local_f08 = (string *)(lVar5 + 0x38);
        local_f10 = local_f48;
        local_f18 = local_f50;
        local_f20 = local_f58;
        local_f28 = local_f60;
        local_f30 = local_f68;
        local_f00 = local_10f0;
        local_ef8 = lVar5;
        local_ef0 = local_f08;
        local_ee8 = local_10f0;
        local_ee0 = lVar5;
        local_ed8 = local_f08;
        local_ed0 = local_10f0;
        std::operator<<(aoStack_10e0,local_f08);
        local_ea0 = local_f00;
        local_ea8 = local_f10;
        local_eb0 = local_f18;
        local_eb8 = local_f20;
        local_ec0 = local_f28;
        local_ec8 = local_f30;
        local_e88 = local_f00;
        local_e90 = local_f10;
        local_e70 = local_f00;
        local_e78 = local_f10;
        local_e98 = lVar5;
        local_e80 = lVar5;
        std::operator<<((ostream *)(local_f00 + 0x10),local_f10);
        local_e48 = local_ea0;
        local_e50 = local_eb0;
        local_e58 = local_eb8;
        local_e60 = local_ec0;
        local_e68 = local_ec8;
        local_e30 = local_ea0;
        local_e38 = local_eb0;
        local_e18 = local_ea0;
        local_e20 = local_eb0;
        local_e40 = lVar5;
        local_e28 = lVar5;
        std::ostream::operator<<((ostream *)(local_ea0 + 0x10),*local_eb0);
        local_df8 = local_e48;
        local_e00 = local_e58;
        local_e08 = local_e60;
        local_e10 = local_e68;
        local_de0 = local_e48;
        local_de8 = local_e58;
        local_da8 = local_e48;
        local_db0 = local_e58;
        local_df0 = lVar5;
        local_dd8 = lVar5;
        std::operator<<((ostream *)(local_e48 + 0x10),local_e58);
        local_dc0 = local_df8;
        local_dc8 = local_e08;
        local_dd0 = local_e10;
        local_d98 = local_df8;
        local_da0 = local_e08;
        local_d80 = local_df8;
        local_d88 = local_e08;
        local_db8 = lVar5;
        local_d90 = lVar5;
        std::ostream::operator<<((ostream *)(local_df8 + 0x10),*local_e08);
        local_d70 = local_dc0;
        local_d78 = local_dd0;
        local_d58 = local_dc0;
        local_d60 = local_dd0;
        local_d68 = lVar5;
        std::operator<<((ostream *)(local_dc0 + 0x10),local_dd0);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18d4dd);
      }
      local_1664 = Free;
    }
  }
  else {
    local_1540 = &local_1689;
    local_1724 = 0;
    if ((local_1689.FlagsByte & 0x40) != 0) {
      local_1724 = 0xc;
    }
    if (local_1724 == 0) {
      lVar5 = *(long *)(in_RDI + 0x90);
      local_1530 = &stack0x00000010;
      local_1528 = "Ignoring non-handshake packet from unrecognized source (bytes = ";
      local_1538 = ")";
      local_d34 = 3;
      local_d40 = "Ignoring non-handshake packet from unrecognized source (bytes = ";
      local_d50 = ")";
      local_d24 = 3;
      local_1520 = lVar5;
      local_d48 = local_1530;
      local_d30 = lVar5;
      local_d20 = lVar5;
      if (*(int *)(lVar5 + 8) < 4) {
        local_b64 = 3;
        local_b70 = "Ignoring non-handshake packet from unrecognized source (bytes = ";
        local_b80 = ")";
        local_b78 = local_1530;
        local_b60 = lVar5;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
        local_b40 = (string *)(lVar5 + 0x38);
        local_b48 = local_b70;
        local_b50 = local_b78;
        local_b58 = local_b80;
        local_b38 = local_d08;
        local_b30 = lVar5;
        local_b28 = local_b40;
        local_b20 = local_d08;
        local_b18 = lVar5;
        local_b10 = local_b40;
        local_b08 = local_d08;
        std::operator<<(aoStack_cf8,local_b40);
        local_ae8 = local_b38;
        local_af0 = local_b48;
        local_af8 = local_b50;
        local_b00 = local_b58;
        local_a60 = local_b38;
        local_a68 = local_b48;
        local_a48 = local_b38;
        local_a50 = local_b48;
        local_ae0 = lVar5;
        local_a58 = lVar5;
        std::operator<<((ostream *)(local_b38 + 0x10),local_b48);
        local_ac8 = local_ae8;
        local_ad0 = local_af8;
        local_ad8 = local_b00;
        local_ab0 = local_ae8;
        local_ab8 = local_af8;
        local_a98 = local_ae8;
        local_aa0 = local_af8;
        local_ac0 = lVar5;
        local_aa8 = lVar5;
        std::ostream::operator<<((ostream *)(local_ae8 + 0x10),*local_af8);
        local_a88 = local_ac8;
        local_a90 = local_ad8;
        local_a70 = local_ac8;
        local_a78 = local_ad8;
        local_a80 = lVar5;
        std::operator<<((ostream *)(local_ac8 + 0x10),local_ad8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18d9a2);
      }
      local_1658 = *(long *)(in_RDI + 0x88);
      std::__atomic_base<int>::operator++((__atomic_base<int> *)(local_1658 + 0x28));
      std::__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x18d9de);
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe580,
                 (basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe578);
      asio::io_context::strand::
      post<tonk::UDPSocket::onUnrecognizedSource(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_long,tonk::DatagramBuffer)::__1>
                (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
      local_1664 = Free;
    }
    else {
      local_1758 = local_1688 + (-3 - (ulong)local_1724);
      local_175c = protocol::handshake::GetType(local_1758);
      key_00 = (key_t)((ulong)in_stack_ffffffffffffe5b0 >> 0x20);
      if (local_175c == HandshakeType_C2SConnectionRequest) {
        local_15c0 = *(undefined8 *)(in_RDI + 0x80);
        Locker::Locker((Locker *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        pktalloc::Allocator::Shrink
                  (in_stack_ffffffffffffe5a0,(uint8_t *)in_stack_ffffffffffffe598,
                   (uint)((ulong)in_stack_ffffffffffffe590 >> 0x20));
        Locker::~Locker((Locker *)0x18db34);
        local_1768 = protocol::handshake::GetKey(local_1758);
        local_1660 = *(long *)(in_RDI + 0x88);
        std::__atomic_base<int>::operator++((__atomic_base<int> *)(local_1660 + 0x28));
        std::__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x18db88);
        local_17b8 = local_1768;
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe580,
                   (basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe578);
        local_1790 = local_1680;
        asio::io_context::strand::
        post<tonk::UDPSocket::onUnrecognizedSource(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_long,tonk::DatagramBuffer)::__2>
                  ((strand *)in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8);
        local_1664 = InUse;
      }
      else if (local_175c == HandshakeType_Peer2PeerConnect) {
        local_17c8 = protocol::handshake::GetKey(local_1758);
        uVar3 = (uint)((ulong)in_stack_ffffffffffffe590 >> 0x20);
        local_17cc = (undefined4)local_17c8;
        local_17d8 = P2PConnectionKeyMap::FindByKey
                               ((P2PConnectionKeyMap *)in_stack_ffffffffffffe5b8,key_00);
        if (local_17d8 == (IConnection *)0x0) {
          lVar5 = *(long *)(in_RDI + 0x90);
          HexString_abi_cxx11_((uint64_t)in_stack_ffffffffffffe5d8);
          local_1510 = "Peer2Peer connection with unrecognized key = ";
          local_1518 = local_1820;
          local_a2c = 3;
          local_a38 = "Peer2Peer connection with unrecognized key = ";
          local_a1c = 3;
          local_1508 = lVar5;
          local_a40 = local_1518;
          local_a28 = lVar5;
          local_a18 = lVar5;
          if (*(int *)(lVar5 + 8) < 4) {
            local_864 = 3;
            local_870 = "Peer2Peer connection with unrecognized key = ";
            local_878 = local_1518;
            local_860 = lVar5;
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
            local_848 = (string *)(lVar5 + 0x38);
            local_840 = local_a00;
            local_850 = local_870;
            local_858 = local_878;
            local_838 = lVar5;
            local_830 = local_848;
            local_828 = local_840;
            local_820 = lVar5;
            local_818 = local_848;
            local_810 = local_840;
            std::operator<<(aoStack_9f0,local_848);
            local_7f8 = local_840;
            local_800 = local_850;
            local_808 = local_858;
            local_7b8 = local_840;
            local_7c0 = local_850;
            local_7a0 = local_840;
            local_7a8 = local_850;
            local_7f0 = lVar5;
            local_7b0 = lVar5;
            std::operator<<((ostream *)(local_840 + 0x10),local_850);
            local_7e0 = local_7f8;
            local_7e8 = local_808;
            local_7c8 = local_7f8;
            local_7d0 = local_808;
            local_7d8 = lVar5;
            std::operator<<((ostream *)(local_7f8 + 0x10),local_808);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18e1a1);
          }
          std::__cxx11::string::~string(local_1820);
          local_1664 = Free;
        }
        else {
          local_15f0 = *(undefined8 *)(in_RDI + 0x80);
          Locker::Locker((Locker *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
          pktalloc::Allocator::Shrink
                    (in_stack_ffffffffffffe5a0,(uint8_t *)in_stack_ffffffffffffe598,uVar3);
          Locker::~Locker((Locker *)0x18dd55);
          local_17e0 = local_17d8;
          datagram_01._8_8_ = in_stack_ffffffffffffe638;
          datagram_01.Data = (uint8_t *)in_stack_ffffffffffffe630;
          datagram_01.FreePtr = (void *)in_stack_ffffffffffffe640;
          datagram_01.AllocatorForFree = in_stack_ffffffffffffe648;
          Connection::OnP2PConnection
                    (in_stack_ffffffffffffe620,(uint64_t)in_stack_ffffffffffffe618,
                     in_stack_ffffffffffffe610,datagram_01,(uint64_t)in_stack_ffffffffffffe608,
                     (ConnectionAddrMap *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5f8);
          local_1664 = InUse;
        }
      }
      else if (local_175c == HandshakeType_C2SUpdateSourceAddress) {
        local_1824 = protocol::handshake::GetConnectionId(local_1758);
        p_Var1 = (__pthread_internal_list *)protocol::handshake::GetKey(local_1758);
        lVar5 = *(long *)(in_RDI + 0xc0);
        local_14dc = local_1824;
        local_14d8 = lVar5;
        Locker::Locker((Locker *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        this_00 = (LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *)
                  (lVar5 + 0x30);
        local_1470 = &local_14dc;
        local_1468 = this_00;
        local_1474 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::find_index
                               (in_stack_ffffffffffffe598,in_stack_ffffffffffffe590);
        uVar3 = (uint)((ulong)in_stack_ffffffffffffe590 >> 0x20);
        if ((int)local_1474 < 0) {
          local_1460 = (IConnection *)0x0;
        }
        else {
          pnVar2 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::get_node
                             (this_00,local_1474);
          local_1460 = (pnVar2->super_value_type).second;
        }
        local_14f0 = local_1460;
        if (local_1460 != (IConnection *)0x0) {
          local_14d0 = &local_1460->SelfRefCount;
          std::__atomic_base<int>::operator++
                    (&(local_1460->SelfRefCount).RefCount.super___atomic_base<int>);
        }
        pIVar7 = local_14f0;
        Locker::~Locker((Locker *)0x18e3bf);
        if (pIVar7 != (IConnection *)0x0) {
          local_14c8 = pIVar7;
          if (pIVar7[0x217].SelfRefCount.ShutdownLock.super___mutex_base._M_mutex.__data.__list.
              __next == p_Var1) {
            local_1620 = *(undefined8 *)(in_RDI + 0x80);
            Locker::Locker((Locker *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
            pktalloc::Allocator::Shrink
                      (in_stack_ffffffffffffe5a0,(uint8_t *)in_stack_ffffffffffffe598,uVar3);
            Locker::~Locker((Locker *)0x18e4d1);
            pBVar6 = *(BufferAllocator **)(in_RDI + 0x90);
            local_14b8 = "Switching connection address for ID ";
            local_14c0 = &local_1824;
            local_784 = 3;
            local_790 = "Switching connection address for ID ";
            local_774 = 3;
            local_14b0 = pBVar6;
            local_798 = local_14c0;
            local_780 = pBVar6;
            local_770 = pBVar6;
            if ((pBVar6->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__data.__owner < 4)
            {
              local_5bc = 3;
              local_5c8 = "Switching connection address for ID ";
              in_stack_ffffffffffffe610 = local_758;
              local_5d0 = local_14c0;
              local_5b8 = pBVar6;
              logger::LogStringBuffer::LogStringBuffer
                        (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
              local_5a0 = (string *)((pBVar6->Allocator).PreferredWindows.PreallocatedData + 1);
              local_5a8 = local_5c8;
              local_5b0 = local_5d0;
              in_stack_ffffffffffffe600 = pBVar6;
              local_598 = in_stack_ffffffffffffe610;
              local_590 = pBVar6;
              local_588 = local_5a0;
              local_580 = in_stack_ffffffffffffe610;
              local_578 = pBVar6;
              local_570 = local_5a0;
              local_568 = in_stack_ffffffffffffe610;
              std::operator<<((ostream *)
                              ((in_stack_ffffffffffffe610->impl_).data_.v6.sin6_addr.__in6_u.
                               __u6_addr8 + 8),local_5a0);
              local_550 = local_598;
              local_558 = local_5a8;
              local_560 = local_5b0;
              local_510 = local_598;
              local_518 = local_5a8;
              local_4f8 = local_598;
              local_500 = local_5a8;
              in_stack_ffffffffffffe618 = in_stack_ffffffffffffe600;
              local_548 = in_stack_ffffffffffffe600;
              local_508 = in_stack_ffffffffffffe600;
              std::operator<<((ostream *)
                              ((local_598->impl_).data_.v6.sin6_addr.__in6_u.__u6_addr8 + 8),
                              local_5a8);
              local_538 = local_550;
              local_540 = local_560;
              local_520 = local_550;
              local_528 = local_560;
              local_530 = in_stack_ffffffffffffe600;
              std::ostream::operator<<
                        ((ostream *)((local_550->impl_).data_.v6.sin6_addr.__in6_u.__u6_addr8 + 8),
                         *local_560);
              logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
              logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18e840);
              in_stack_ffffffffffffe608 = pBVar6;
            }
            std::atomic<bool>::operator=
                      ((atomic<bool> *)in_stack_ffffffffffffe580,
                       SUB81((ulong)in_stack_ffffffffffffe578 >> 0x38,0));
            datagram_00._8_8_ = in_stack_ffffffffffffe608;
            datagram_00.Data = (uint8_t *)in_stack_ffffffffffffe600;
            datagram_00.FreePtr = in_stack_ffffffffffffe610;
            datagram_00.AllocatorForFree = in_stack_ffffffffffffe618;
            Connection::OnUDPDatagram
                      (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
                       (UDPAddress *)in_stack_ffffffffffffe5e0,datagram_00);
            return InUse;
          }
          local_14a8 = &pIVar7->SelfRefCount;
          std::__atomic_base<int>::operator--
                    (&(pIVar7->SelfRefCount).RefCount.super___atomic_base<int>);
        }
        lVar5 = *(long *)(in_RDI + 0x90);
        local_1498 = "Reconnect failed: Unrecognized ID ";
        local_14a0 = &local_1824;
        local_4dc = 3;
        local_4e8 = "Reconnect failed: Unrecognized ID ";
        local_4cc = 3;
        if (*(int *)(lVar5 + 8) < 4) {
          local_314 = 3;
          local_320 = "Reconnect failed: Unrecognized ID ";
          puVar4 = local_4b0;
          local_1490 = lVar5;
          local_4f0 = local_14a0;
          local_4d8 = lVar5;
          local_4c8 = lVar5;
          local_328 = local_14a0;
          local_310 = lVar5;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
          local_2f8 = (string *)(lVar5 + 0x38);
          local_300 = local_320;
          local_308 = local_328;
          local_2f0 = puVar4;
          local_2e8 = lVar5;
          local_2e0 = local_2f8;
          local_2d8 = puVar4;
          local_2d0 = lVar5;
          local_2c8 = local_2f8;
          local_2c0 = puVar4;
          std::operator<<((ostream *)(puVar4 + 0x10),local_2f8);
          local_2a8 = local_2f0;
          local_2b0 = local_300;
          local_2b8 = local_308;
          local_290 = local_2f0;
          local_298 = local_300;
          local_278 = local_2f0;
          local_280 = local_300;
          local_2a0 = lVar5;
          local_288 = lVar5;
          std::operator<<((ostream *)(local_2f0 + 0x10),local_300);
          local_268 = local_2a8;
          local_270 = local_2b8;
          local_250 = local_2a8;
          local_258 = local_2b8;
          local_260 = lVar5;
          std::ostream::operator<<((ostream *)(local_2a8 + 0x10),*local_2b8);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18ec50);
        }
        local_1664 = Free;
      }
      else {
        buffer_00 = *(LogStringBuffer **)(in_RDI + 0x90);
        local_1488 = "Unrecognized handshake type";
        local_23c = 3;
        local_248 = "Unrecognized handshake type";
        local_22c = 3;
        if ((int)buffer_00->LogLevel < 4) {
          local_7c = 3;
          local_88 = "Unrecognized handshake type";
          puVar4 = local_210;
          this_01 = buffer_00;
          local_1480 = buffer_00;
          local_238 = buffer_00;
          local_228 = buffer_00;
          local_78 = buffer_00;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe580,(char *)in_stack_ffffffffffffe578,Trace);
          local_68 = &buffer_00->field_0x38;
          local_70 = local_88;
          local_60 = puVar4;
          local_58 = buffer_00;
          local_50 = local_68;
          local_48 = puVar4;
          local_40 = buffer_00;
          local_38 = local_68;
          local_30 = puVar4;
          std::operator<<((ostream *)(puVar4 + 0x10),(string *)local_68);
          local_20 = local_60;
          local_28 = local_70;
          local_8 = local_60;
          local_10 = local_70;
          local_18 = buffer_00;
          std::operator<<((ostream *)(local_60 + 0x10),local_70);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write((OutputWorker *)this_01,buffer_00);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x18eeb7);
        }
        local_1664 = Free;
      }
    }
  }
  return local_1664;
}

Assistant:

UDPSocket::BufferResult UDPSocket::onUnrecognizedSource(
    const UDPAddress& addr,
    const uint64_t receiveUsec,
    DatagramBuffer datagram)
{
    /*
        Footer protocol:
            ...
            [Handshake (12 bytes)]
            <Timestamp (3 bytes)>
            <Flags (1 byte)>
            <Encryption Tag (2 bytes)>
    */
    const uint8_t* footer = datagram.Data + datagram.Bytes - protocol::kEncryptionTagBytes - protocol::kFlagsBytes;
    protocol::FlagsReader flags(footer[0]);

    // If this is an unconnected datagram:
    if (!flags.IsConnectionDatagram())
    {
        const unsigned unconnectedType = flags.GetUnconnectedType();

        // If this is a NAT probe:
        if (protocol::Unconnected_P2PNATProbe == unconnectedType &&
            protocol::kNATProbeBytes == datagram.Bytes)
        {
            uint32_t key = siamese::ReadU16_LE(footer - 2);
            key = (key << 16) | siamese::ReadU16_LE(footer + 1);

            // If there is a NAT probe in progress:
            IConnection* icon = Deps.P2PKeyMap->FindByKey(key);
            // Note the connection reference count was incremented by FindByKey()
            if (icon) {
                Connection* connection = reinterpret_cast<Connection*>(icon);
                connection->OnNATProbe(addr, key, &AddressMap, this);
            }
            else {
                Deps.Logger->Warning("NAT probe received with key = ", HexString(key), " not found in map");
            }

            return BufferResult::Free;
        }

        // If this is an advertisement
        if (protocol::Unconnected_Advertisement == unconnectedType &&
            protocol::kAdvertisementOverheadBytes <= datagram.Bytes &&
            protocol::kMagicAdvertisement == siamese::ReadU32_LE(footer - 4))
        {
            // If the application is not requesting advertisements, skip the async work
            if (!SocketConfig->OnAdvertisement) {
                return BufferResult::Free;
            }

            // Run callback in the connect strand to avoid blocking datagram processing
            Deps.SocketRefCount->IncrementReferences();
            AsioConnectStrand->post([this, addr, datagram]()
            {
                std::string ipString = addr.address().to_string();

                // Convert IP address to string and pass to app with data
                SocketConfig->OnAdvertisement(
                    SocketConfig->AppContextPtr,
                    APITonkSocket,
                    ipString.c_str(),
                    addr.port(),
                    datagram.Data,
                    datagram.Bytes - protocol::kAdvertisementOverheadBytes);

                datagram.Free();

                Deps.SocketRefCount->DecrementReferences();
            });

            return BufferResult::InUse;
        }

        // Unexpected type from unrecognized source
        Deps.Logger->Warning("Ignoring unexpected unconnected type ", unconnectedType, " from unrecognized source (bytes = ", datagram.Bytes, ")");

        return BufferResult::Free;
    }

    const unsigned handshakeBytes = flags.HandshakeBytes();
    if (handshakeBytes <= 0)
    {
        // Non-handshake from unrecognized source
        Deps.Logger->Warning("Ignoring non-handshake packet from unrecognized source (bytes = ", datagram.Bytes, ")");

        Deps.SocketRefCount->IncrementReferences();
        AsioConnectStrand->post([this, addr]()
        {
            DatagramBuffer datagram;
            datagram.AllocatorForFree = Deps.ReadBufferAllocator;
            datagram.Bytes = protocol::kS2CUnknownSourceBytes;
            datagram.Data = Deps.ReadBufferAllocator->Allocate(protocol::kS2CUnknownSourceBytes);
            datagram.FreePtr = datagram.Data;

            if (datagram.Data)
            {
                protocol::GenerateS2CUnknownSource(datagram.Data);
                Send(addr, datagram, Deps.SocketRefCount);
            }

            Deps.SocketRefCount->DecrementReferences();
        });

        return BufferResult::Free;
    }

    // Get pointer to the handshake data
    const uint8_t* handshakeData = footer - handshakeBytes - protocol::kTimestampBytes;

    // Decode handshake type
    const protocol::HandshakeType handshakeType = protocol::handshake::GetType(handshakeData);

    // If this is a connection request datagram:
    if (handshakeType == protocol::HandshakeType_C2SConnectionRequest)
    {
        // Shrink the datagram buffer before passing to connection
        Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        Deps.SocketRefCount->IncrementReferences();
        AsioConnectStrand->post([this, key, addr, receiveUsec, datagram]()
        {
            onConnectRequest(key, addr, receiveUsec, datagram);
            Deps.SocketRefCount->DecrementReferences();
        });

        return BufferResult::InUse;
    }

    // If this is a peer2peer connection request:
    if (handshakeType == protocol::HandshakeType_Peer2PeerConnect)
    {
        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        // Note: The P2PKeyMap should match the low 4 bytes of the encryption key
        const uint32_t connKey = static_cast<uint32_t>(key);

        IConnection* icon = Deps.P2PKeyMap->FindByKey(connKey);
        // Note the connection reference count was incremented by FindByKey()

        // If there is a NAT probe in progress:
        if (icon)
        {
            // Shrink the datagram buffer before passing to connection
            Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

            Connection* connection = reinterpret_cast<Connection*>(icon);
            connection->OnP2PConnection(
                receiveUsec,
                addr,
                datagram,
                key,
                &AddressMap,
                this);
            return BufferResult::InUse;
        }

        Deps.Logger->Warning("Peer2Peer connection with unrecognized key = ", HexString(key));

        // Unrecognized connection request
        return BufferResult::Free;
    }

    // If this handshake is updating a source address:
    if (handshakeType == protocol::HandshakeType_C2SUpdateSourceAddress)
    {
        const uint32_t id = protocol::handshake::GetConnectionId(handshakeData);
        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        IConnection* icon = Deps.IdMap->FindById(id);
        // Note the connection reference count was incremented by FindById()
        if (icon)
        {
            Connection* connection = reinterpret_cast<Connection*>(icon);
            if (connection->GetEncryptionKey() == key)
            {
                // Shrink the datagram buffer before passing to connection
                Deps.ReadBufferAllocator->Shrink(datagram.Data, datagram.Bytes);

                Deps.Logger->Warning("Switching connection address for ID ", id);

                connection->PeerAddressChangesAllowed = true;

                connection->OnUDPDatagram(receiveUsec, addr, datagram);
                return BufferResult::InUse;
            }

            // FindById() has incremented the reference count, so decrement it here
            connection->SelfRefCount.DecrementReferences();
        }

        Deps.Logger->Warning("Reconnect failed: Unrecognized ID ", id);
        return BufferResult::Free;
    }

    // Not a handshake:
    Deps.Logger->Warning("Unrecognized handshake type");
    return BufferResult::Free;
}